

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

int __thiscall
kratos::ForStmt::clone(ForStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  shared_ptr<kratos::ForStmt> sVar2;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_48 [8];
  shared_ptr<kratos::ForStmt> stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  sVar2 = std::
          make_shared<kratos::ForStmt,std::__cxx11::string&,long_const&,long_const&,long_const&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     (long *)(*(long *)(__fn + 0xc0) + 0x78),(long *)(__fn + 0xd0),
                     (long *)(__fn + 0xd8));
  (**(code **)(**(long **)(__fn + 0xe8) + 0x58))
            (local_58,*(long **)(__fn + 0xe8),
             sVar2.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ._M_pi);
  Stmt::as<kratos::ScopedStmtBlock>
            ((Stmt *)&stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_48 + 0xe8),
             (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
             &stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  (**(code **)(*(long *)*(_func_int **)((long)local_48 + 0xe8) + 0x38))();
  std::__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> *)((long)local_48 + 0xc0),
             (__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> *)(__fn + 0xc0));
  this_00 = &stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::ForStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  Stmt::copy_meta((Stmt *)__fn,(shared_ptr<kratos::Stmt> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  peVar1 = stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)local_48;
  stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar1;
  local_48 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> ForStmt::clone() const {
    auto stmt = std::make_shared<ForStmt>(iter_->name, start_, end_, step_);
    stmt->loop_body_ = loop_body_->clone()->as<ScopedStmtBlock>();
    stmt->loop_body_->set_parent(stmt.get());
    // share the iter expression
    stmt->iter_ = iter_;
    copy_meta(stmt);
    return stmt;
}